

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O2

void uv__print_handles(uv_loop_t *loop,int only_active,void *stream)

{
  uv__queue *puVar1;
  uint uVar2;
  char *pcVar3;
  uv__queue *puVar4;
  
  if (loop == (uv_loop_t *)0x0) {
    loop = uv_default_loop();
  }
  if (stream == (void *)0x0) {
    stream = _stderr;
  }
  puVar4 = &loop->handle_queue;
  while (puVar4 = puVar4->next, puVar4 != &loop->handle_queue) {
    if ((only_active == 0) || (((ulong)puVar4[1].prev & 4) != 0)) {
      uVar2 = *(int *)&puVar4[-1].next - 1;
      pcVar3 = "<unknown>";
      if (uVar2 < 0x10) {
        pcVar3 = &DAT_001da8b0 + *(int *)(&DAT_001da8b0 + (ulong)uVar2 * 4);
      }
      puVar1 = puVar4[1].prev;
      fprintf((FILE *)stream,"[%c%c%c] %-8s %p\n",(ulong)(uint)(int)"R-"[((ulong)puVar1 & 8) == 0],
              (ulong)(uint)(int)"A-"[((ulong)puVar1 & 4) == 0],
              (ulong)(uint)(int)"I-"[((ulong)puVar1 & 0x10) == 0],pcVar3,puVar4 + -2);
    }
  }
  return;
}

Assistant:

static void uv__print_handles(uv_loop_t* loop, int only_active, void* stream) {
  const char* type;
  struct uv__queue* q;
  uv_handle_t* h;

  if (loop == NULL)
    loop = uv_default_loop();

  if (stream == NULL)
    stream = stderr;

  uv__queue_foreach(q, &loop->handle_queue) {
    h = uv__queue_data(q, uv_handle_t, handle_queue);

    if (only_active && !uv__is_active(h))
      continue;

    switch (h->type) {
#define X(uc, lc) case UV_##uc: type = #lc; break;
      UV_HANDLE_TYPE_MAP(X)
#undef X
      default: type = "<unknown>";
    }

    fprintf(stream,
            "[%c%c%c] %-8s %p\n",
            "R-"[!(h->flags & UV_HANDLE_REF)],
            "A-"[!(h->flags & UV_HANDLE_ACTIVE)],
            "I-"[!(h->flags & UV_HANDLE_INTERNAL)],
            type,
            (void*)h);
  }
}